

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressStream(ZSTD_CStream *zcs,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  uint uVar1;
  size_t err_code;
  ZSTD_EndDirective in_stack_00000024;
  ZSTD_inBuffer *in_stack_00000028;
  ZSTD_outBuffer *in_stack_00000030;
  ZSTD_CCtx *in_stack_00000038;
  undefined8 local_8;
  
  local_8 = (ZSTD_CCtx *)
            ZSTD_compressStream2
                      (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000024);
  uVar1 = ERR_isError((size_t)local_8);
  if (uVar1 == 0) {
    local_8 = (ZSTD_CCtx *)ZSTD_nextInputSizeHint_MTorST(local_8);
  }
  return (size_t)local_8;
}

Assistant:

size_t ZSTD_compressStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    FORWARD_IF_ERROR( ZSTD_compressStream2(zcs, output, input, ZSTD_e_continue) , "");
    return ZSTD_nextInputSizeHint_MTorST(zcs);
}